

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O3

void Sfm_NtkUpdateLevel_rec(Sfm_Ntk_t *p,int iNode)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Vec_Str_t *pVVar3;
  int *piVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  
  if ((-1 < iNode) && (iNode < (p->vFanins).nSize)) {
    pVVar2 = (p->vFanins).pArray;
    pVVar3 = p->vEmpty;
    if (pVVar3 == (Vec_Str_t *)0x0) {
      uVar5 = 1;
    }
    else {
      if (pVVar3->nSize <= iNode) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      uVar5 = (uint)(pVVar3->pArray[(uint)iNode] == '\0');
    }
    lVar7 = (long)pVVar2[(uint)iNode].nSize;
    if (lVar7 < 1) {
      iVar9 = (p->vLevels).nSize;
      iVar6 = 0;
    }
    else {
      lVar8 = 0;
      iVar6 = 0;
      do {
        iVar1 = pVVar2[(uint)iNode].pArray[lVar8];
        if (((long)iVar1 < 0) || (iVar9 = (p->vLevels).nSize, iVar9 <= iVar1)) goto LAB_00534334;
        iVar1 = (p->vLevels).pArray[iVar1];
        if (iVar6 <= iVar1) {
          iVar6 = iVar1;
        }
        lVar8 = lVar8 + 1;
      } while (lVar7 != lVar8);
    }
    if (iVar9 <= iNode) {
LAB_00534334:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    piVar4 = (p->vLevels).pArray;
    if (iVar6 + uVar5 == piVar4[(uint)iNode]) {
      return;
    }
    piVar4[(uint)iNode] = iVar6 + uVar5;
    if (iNode < (p->vFanouts).nSize) {
      lVar7 = 0;
      do {
        pVVar2 = (p->vFanouts).pArray;
        if (pVVar2[(uint)iNode].nSize <= lVar7) {
          return;
        }
        Sfm_NtkUpdateLevel_rec(p,pVVar2[(uint)iNode].pArray[lVar7]);
        lVar7 = lVar7 + 1;
      } while (iNode < (p->vFanouts).nSize);
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
}

Assistant:

void Sfm_NtkUpdateLevel_rec( Sfm_Ntk_t * p, int iNode )
{
    int i, iFanout;
    int LevelNew = Sfm_ObjLevelNew( Sfm_ObjFiArray(p, iNode), &p->vLevels, Sfm_ObjAddsLevel(p, iNode) );
    if ( LevelNew == Sfm_ObjLevel(p, iNode) )
        return;
    Sfm_ObjSetLevel( p, iNode, LevelNew );
    Sfm_ObjForEachFanout( p, iNode, iFanout, i )
        Sfm_NtkUpdateLevel_rec( p, iFanout );
}